

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O0

ion_err_t oafh_find_item_loc(ion_file_hashmap_t *hash_map,ion_key_t key,int *location)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__ptr;
  int key_is_equal;
  int record_size;
  ion_hash_bucket_t *item;
  int local_30;
  int count;
  int loc;
  ion_hash_t hash;
  int *location_local;
  ion_key_t key_local;
  ion_file_hashmap_t *hash_map_local;
  
  iVar2 = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  local_30 = oafh_get_location(iVar2,hash_map->map_size);
  item._4_4_ = 0;
  iVar2 = (hash_map->super).record.key_size + (hash_map->super).record.value_size;
  iVar3 = iVar2 + 1;
  __ptr = (char *)malloc((long)iVar3);
  fseek((FILE *)hash_map->file,(long)(local_30 * iVar3),0);
  while( true ) {
    if (item._4_4_ == hash_map->map_size) {
      free(__ptr);
      return '\x01';
    }
    fread(__ptr,1,1,(FILE *)hash_map->file);
    fread(__ptr + 1,(long)iVar2,1,(FILE *)hash_map->file);
    if (*__ptr == -1) break;
    if ((*__ptr != -2) &&
       (cVar1 = (*(hash_map->super).compare)(__ptr + 1,key,(hash_map->super).record.key_size),
       cVar1 == '\0')) {
      *location = local_30;
      free(__ptr);
      return '\0';
    }
    local_30 = local_30 + 1;
    item._4_4_ = item._4_4_ + 1;
    if (hash_map->map_size <= local_30) {
      local_30 = 0;
      rewind((FILE *)hash_map->file);
    }
  }
  free(__ptr);
  return '\x01';
}

Assistant:

ion_err_t
oafh_find_item_loc(
	ion_file_hashmap_t	*hash_map,
	ion_key_t			key,
	int					*location
) {
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);
	/* compute hash value for given key */

	int loc			= oafh_get_location(hash, hash_map->map_size);
	/* determine bucket based on hash */

	int count		= 0;

	ion_hash_bucket_t *item;

	int record_size = hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS);

	item = malloc(record_size);

	/* set file position */
	fseek(hash_map->file, loc * record_size, SEEK_SET);

	/* needs to traverse file again */
	while (count != hash_map->map_size) {
		fread(&item->status, SIZEOF(STATUS), 1, hash_map->file);
		fread(item->data, record_size - SIZEOF(STATUS), 1, hash_map->file);

		if (item->status == ION_EMPTY) {
			free(item);
			return err_item_not_found;	/* if you hit an empty cell, exit */
		}
		else {
			/* calculate if there is a match */

			if (item->status != ION_DELETED) {
				int key_is_equal = hash_map->super.compare(item->data, key, hash_map->super.record.key_size);

				if (ION_IS_EQUAL == key_is_equal) {
					(*location) = loc;
					free(item);
					return err_ok;
				}
			}

			loc++;
			count++;

			if (loc >= hash_map->map_size) {
				/* Perform wrapping */
				loc = 0;
				frewind(hash_map->file);
			}
		}
	}

	free(item);
	return err_item_not_found;	/* key have not been found */
}